

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_file_utils.cpp
# Opt level: O0

bool crnlib::file_utils::split_path(char *p,dynamic_string *path,dynamic_string *filename)

{
  bool bVar1;
  char *pA;
  char *pB;
  undefined1 local_68 [8];
  dynamic_string temp_ext;
  undefined1 local_48 [8];
  dynamic_string temp_path;
  dynamic_string temp_drive;
  dynamic_string *filename_local;
  dynamic_string *path_local;
  char *p_local;
  
  dynamic_string::dynamic_string((dynamic_string *)&temp_path.m_pStr);
  dynamic_string::dynamic_string((dynamic_string *)local_48);
  dynamic_string::dynamic_string((dynamic_string *)local_68);
  bVar1 = split_path(p,(dynamic_string *)&temp_path.m_pStr,(dynamic_string *)local_48,filename,
                     (dynamic_string *)local_68);
  if (bVar1) {
    dynamic_string::operator+=(filename,(dynamic_string *)local_68);
    pA = dynamic_string::get_ptr((dynamic_string *)&temp_path.m_pStr);
    pB = dynamic_string::get_ptr((dynamic_string *)local_48);
    combine_path(path,pA,pB);
  }
  dynamic_string::~dynamic_string((dynamic_string *)local_68);
  dynamic_string::~dynamic_string((dynamic_string *)local_48);
  dynamic_string::~dynamic_string((dynamic_string *)&temp_path.m_pStr);
  return bVar1;
}

Assistant:

bool file_utils::split_path(const char* p, dynamic_string& path, dynamic_string& filename)
    {
        dynamic_string temp_drive, temp_path, temp_ext;
        if (!split_path(p, &temp_drive, &temp_path, &filename, &temp_ext))
        {
            return false;
        }

        filename += temp_ext;

        combine_path(path, temp_drive.get_ptr(), temp_path.get_ptr());
        return true;
    }